

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O3

actions_fun * __thiscall
estl::state_machine<cd_fsm_def>::get_action_function
          (actions_fun *__return_storage_ptr__,state_machine<cd_fsm_def> *this,state_type from_state
          )

{
  pointer paVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer paVar5;
  
  paVar5 = (this->actions_).
           super__Vector_base<estl::state_machine<cd_fsm_def>::action_entry,_std::allocator<estl::state_machine<cd_fsm_def>::action_entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar1 = (this->actions_).
           super__Vector_base<estl::state_machine<cd_fsm_def>::action_entry,_std::allocator<estl::state_machine<cd_fsm_def>::action_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (long)paVar1 - (long)paVar5;
  if (0 < (long)uVar2) {
    uVar2 = (uVar2 >> 3) * -0x3333333333333333;
    do {
      uVar3 = uVar2 >> 1;
      uVar4 = uVar3;
      if (paVar5[uVar3].state < from_state) {
        uVar4 = ~uVar3 + uVar2;
        paVar5 = paVar5 + uVar3 + 1;
      }
      uVar2 = uVar4;
    } while (0 < (long)uVar4);
  }
  if ((paVar5 == paVar1) || (paVar5->state != from_state)) {
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  }
  else {
    std::function<void_(const_cd_fsm_def::inputs_type_&,_cd_fsm_def::outputs_type_&)>::function
              (__return_storage_ptr__,&paVar5->do_actions);
  }
  return __return_storage_ptr__;
}

Assistant:

actions_fun get_action_function(state_type from_state) const
    {
        constexpr auto compare = [](const action_entry& lhs, state_type state) -> bool {
            return lhs.state < state;
        };

        const auto it = std::lower_bound(actions_.begin(), actions_.end(), from_state, compare);
        if (it != actions_.end() && it->state == from_state) {
            return it->do_actions;
        }
        return nullptr;
    }